

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::internal::
     handle_dynamic_spec<fmt::v5::internal::precision_checker,int,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
               (int *value,arg_ref<char> ref,
               basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
               *ctx)

{
  basic_string_view<char> name;
  undefined8 in_RDI;
  int in_stack_00000008;
  char *in_stack_00000010;
  size_t in_stack_00000018;
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  *in_stack_ffffffffffffff38;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *in_stack_ffffffffffffff40;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *in_stack_ffffffffffffff70;
  undefined4 *puVar1;
  undefined4 in_stack_ffffffffffffff84;
  basic_string_view<char> local_78 [3];
  undefined1 local_39 [57];
  
  puVar1 = &stack0x00000008;
  if (in_stack_00000008 != 0) {
    if (in_stack_00000008 == 1) {
      basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
      ::get_arg(in_stack_ffffffffffffff40,(uint)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
      ::error_handler(in_stack_ffffffffffffff38);
      set_dynamic_spec<fmt::v5::internal::precision_checker,int,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,fmt::v5::internal::error_handler>
                (in_RDI,local_39);
    }
    else if (in_stack_00000008 == 2) {
      basic_string_view<char>::basic_string_view(local_78,in_stack_00000010,in_stack_00000018);
      name.size_._0_4_ = in_stack_00000008;
      name.data_ = (char *)puVar1;
      name.size_._4_4_ = in_stack_ffffffffffffff84;
      basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
      ::get_arg(in_stack_ffffffffffffff70,name);
      context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
      ::error_handler(in_stack_ffffffffffffff38);
      set_dynamic_spec<fmt::v5::internal::precision_checker,int,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,fmt::v5::internal::error_handler>
                (in_RDI,&stack0xffffffffffffff87);
    }
  }
  return;
}

Assistant:

void handle_dynamic_spec(
    Spec &value, arg_ref<typename Context::char_type> ref, Context &ctx) {
  typedef typename Context::char_type char_type;
  switch (ref.kind) {
  case arg_ref<char_type>::NONE:
    break;
  case arg_ref<char_type>::INDEX:
    internal::set_dynamic_spec<Handler>(
          value, ctx.get_arg(ref.index), ctx.error_handler());
    break;
  case arg_ref<char_type>::NAME:
    internal::set_dynamic_spec<Handler>(
          value, ctx.get_arg({ref.name.value, ref.name.size}),
          ctx.error_handler());
    break;
  }
}